

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::add_extension_fun
          (torrent *this,
          function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
          *ext,client_data_t userdata)

{
  int *piVar1;
  int iVar2;
  shared_ptr<libtorrent::torrent_plugin> tp;
  shared_ptr<libtorrent::torrent_plugin> local_60;
  _Any_data local_50;
  __uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
  local_38;
  _Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> local_30;
  element_type *local_28;
  
  get_handle((torrent *)&stack0xffffffffffffffc0);
  local_30._M_head_impl = (hash_picker *)userdata.m_type_ptr;
  local_28 = (element_type *)userdata.m_client_ptr;
  if ((ext->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*ext->_M_invoker)(&local_50,(torrent_handle *)ext,(client_data_t *)&stack0xffffffffffffffc0);
    if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         )local_38._M_t.
          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
        (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)local_38._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl + 0xc);
        iVar2 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar2 = *(int *)((long)local_38._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl + 0xc);
        *(int *)((long)local_38._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl +
                0xc) = iVar2 + -1;
      }
      if (iVar2 == 1) {
        (**(code **)(*(long *)local_38._M_t.
                              super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                              .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                              _M_head_impl + 0x18))();
      }
    }
    if (local_50._M_unused._M_object != (void *)0x0) {
      local_60.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_50._M_unused._0_8_;
      local_60.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_50._8_8_ + 8) = *(_Atomic_word *)(local_50._8_8_ + 8) + 1;
        }
      }
      add_extension(this,&local_60);
      if (local_60.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.
                   super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    }
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void torrent::add_extension_fun(std::function<std::shared_ptr<torrent_plugin>(torrent_handle const&, client_data_t)> const& ext
		, client_data_t userdata)
	{
		std::shared_ptr<torrent_plugin> tp(ext(get_handle(), userdata));
		if (!tp) return;

		add_extension(tp);
	}